

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::on_finish
          (tag_scalar_vector_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::string_trait_t> *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *this_01;
  undefined8 *puVar4;
  allocator<char> local_295;
  allocator<char> local_294;
  allocator<char> local_293;
  allocator<char> local_292;
  allocator<char> local_291;
  string local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])();
  puVar4 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  do {
    if (puVar4 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::string_trait_t> *)*puVar4;
    if (this_00->m_is_mandatory == true) {
      bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(this_00);
      if (!bVar2) {
        this_01 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_170,"Undefined child mandatory tag: \"",&local_291);
        std::__cxx11::string::string((string *)&local_150,local_170);
        std::operator+(&local_130,&local_150,&this_00->m_name);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1b0,"\". Where parent is: \"",&local_292);
        std::__cxx11::string::string((string *)&local_190,local_1b0);
        std::operator+(&local_110,&local_130,&local_190);
        std::operator+(&local_f0,&local_110,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        std::__cxx11::string::string<std::allocator<char>>(local_1f0,"\". In file \"",&local_293);
        std::__cxx11::string::string((string *)&local_1d0,local_1f0);
        std::operator+(&local_d0,&local_f0,&local_1d0);
        std::operator+(&local_b0,&local_d0,&info->m_file_name);
        std::__cxx11::string::string<std::allocator<char>>(local_230,"\" on line ",&local_294);
        std::__cxx11::string::string((string *)&local_210,local_230);
        std::operator+(&local_90,&local_b0,&local_210);
        std::__cxx11::to_string(&local_250,info->m_line_number);
        std::operator+(&local_70,&local_90,&local_250);
        std::__cxx11::string::string<std::allocator<char>>(local_290,".",&local_295);
        std::__cxx11::string::string((string *)&local_270,local_290);
        std::operator+(&local_50,&local_70,&local_270);
        exception_t<cfgfile::string_trait_t>::exception_t(this_01,&local_50);
        __cxa_throw(this_01,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}